

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::to_component_argument_abi_cxx11_(CompilerMSL *this,uint32_t id)

{
  CompilerError *this_00;
  uint32_t in_EDX;
  undefined4 in_register_00000034;
  __cxx11 local_f8 [32];
  __cxx11 local_d8 [32];
  char local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [33];
  allocator local_37;
  allocator local_36;
  allocator local_35 [20];
  allocator local_21;
  uint32_t local_20;
  uint32_t local_1c;
  uint32_t component_index;
  uint32_t id_local;
  CompilerMSL *this_local;
  
  _component_index = (Compiler *)CONCAT44(in_register_00000034,id);
  local_1c = in_EDX;
  this_local = this;
  local_20 = Compiler::evaluate_constant_u32(_component_index,in_EDX);
  switch(local_20) {
  case 0:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"component::x",&local_21);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_21);
    break;
  case 1:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"component::y",local_35);
    ::std::allocator<char>::~allocator((allocator<char> *)local_35);
    break;
  case 2:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"component::z",&local_36);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_36);
    break;
  case 3:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"component::w",&local_37);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_37);
    break;
  default:
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::to_string(local_d8,local_20);
    ::std::operator+(local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              "The value (");
    ::std::operator+(local_98,local_b8);
    ::std::__cxx11::to_string(local_f8,local_1c);
    ::std::operator+(local_78,local_98);
    ::std::operator+(local_58,(char *)local_78);
    CompilerError::CompilerError(this_00,local_58);
    __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  return this;
}

Assistant:

string CompilerMSL::to_component_argument(uint32_t id)
{
	uint32_t component_index = evaluate_constant_u32(id);
	switch (component_index)
	{
	case 0:
		return "component::x";
	case 1:
		return "component::y";
	case 2:
		return "component::z";
	case 3:
		return "component::w";

	default:
		SPIRV_CROSS_THROW("The value (" + to_string(component_index) + ") of OpConstant ID " + to_string(id) +
		                  " is not a valid Component index, which must be one of 0, 1, 2, or 3.");
		return "component::x";
	}
}